

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CY.hpp
# Opt level: O2

void __thiscall
qclab::qgates::CY<std::complex<double>_>::CY
          (CY<std::complex<double>_> *this,int control,int target,int controlState)

{
  uint __line;
  char *__assertion;
  int target_local;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_001313c8;
  std::make_unique<qclab::qgates::PauliY<std::complex<double>>,int_const&>((int *)&this->gate_);
  if (control < 0) {
    __assertion = "control >= 0";
  }
  else {
    if (-1 < target) {
      if (target != control) {
        return;
      }
      __assertion = "control != target";
      __line = 0x2c;
      goto LAB_0011a815;
    }
    __assertion = "target >= 0";
  }
  __line = 0x2b;
LAB_0011a815:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/qgates/CY.hpp"
                ,__line,
                "qclab::qgates::CY<std::complex<double>>::CY(const int, const int, const int) [T = std::complex<double>]"
               );
}

Assistant:

CY( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliY< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }